

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_next_header_empty.c
# Opt level: O1

void test_archive_read_next_header_empty(void)

{
  int iVar1;
  wchar_t wVar2;
  FILE *pFVar3;
  size_t v2;
  archive_conflict *paVar4;
  char *pcVar5;
  archive *paVar6;
  archive_entry *e;
  archive_entry *local_38;
  
  pFVar3 = fopen("emptyfile","wb");
  fclose(pFVar3);
  pFVar3 = fopen("empty.tar","wb");
  v2 = fwrite(nulls,1,0x200,pFVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'u',0x200,"512",v2,"fwrite(nulls, 1, 512, f)",(void *)0x0);
  fclose(pFVar3);
  paVar4 = (archive_conflict *)archive_read_new();
  iVar1 = archive_read_support_format_raw((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                      (void *)0x0);
  iVar1 = archive_errno((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'#',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar5 = archive_error_string((archive *)paVar4);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L'$',(char *)0x0,"NULL",pcVar5,"archive_error_string(a)",(void *)0x0,L'\0');
  wVar2 = archive_read_open_filename(paVar4,"emptyfile",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'\'',-0x1e,"ARCHIVE_FATAL",(long)wVar2,
                      "archive_read_open_filename(a, \"emptyfile\", 0)",(void *)0x0);
  pcVar5 = archive_error_string((archive *)paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                   ,L'(',(uint)(pcVar5 != (char *)0x0),"NULL != archive_error_string(a)",(void *)0x0
                  );
  archive_read_free((archive *)paVar4);
  paVar6 = archive_read_new();
  iVar1 = archive_read_support_format_raw(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                      (void *)0x0);
  iVar1 = archive_read_support_format_empty(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_empty(a)",
                      (void *)0x0);
  test_empty_file2_check(paVar6);
  paVar6 = archive_read_new();
  iVar1 = archive_read_support_format_by_code(paVar6,0x60000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_support_format_by_code(a, ARCHIVE_FORMAT_EMPTY)",(void *)0x0);
  test_empty_file2_check(paVar6);
  paVar6 = archive_read_new();
  iVar1 = archive_read_set_format(paVar6,0x60000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_format(a, ARCHIVE_FORMAT_EMPTY)",(void *)0x0);
  test_empty_file2_check(paVar6);
  paVar4 = (archive_conflict *)archive_read_new();
  wVar2 = archive_read_support_format_tar((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_tar(a)",
                      (void *)0x0);
  iVar1 = archive_errno((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'Z',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar5 = archive_error_string((archive *)paVar4);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L'[',(char *)0x0,"NULL",pcVar5,"archive_error_string(a)",(void *)0x0,L'\0');
  wVar2 = archive_read_open_filename(paVar4,"empty.tar",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L']',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, \"empty.tar\", 0)",(void *)0x0);
  iVar1 = archive_errno((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'^',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar5 = archive_error_string((archive *)paVar4);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L'_',(char *)0x0,"NULL",pcVar5,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header((archive *)paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'a',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &e)",
                      (void *)0x0);
  iVar1 = archive_errno((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'b',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar5 = archive_error_string((archive *)paVar4);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
             ,L'c',(char *)0x0,"NULL",pcVar5,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_read_free((archive *)paVar4);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_next_header_empty)
{
	FILE *f;

	/* Create an empty file. */
	f = fopen("emptyfile", "wb");
	fclose(f);

	/* Create a file with 512 zero bytes. */
	f = fopen("empty.tar", "wb");
	assertEqualInt(512, fwrite(nulls, 1, 512, f));
	fclose(f);

	test_empty_file1();
	test_empty_file2();
	test_empty_tarfile();

}